

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall tinyusdz::Path::operator<(Path *this,Path *rhs)

{
  __type _Var1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  bool local_7a;
  string local_60;
  string local_40;
  Path *local_20;
  Path *rhs_local;
  Path *this_local;
  
  local_20 = rhs;
  rhs_local = this;
  full_path_name_abi_cxx11_(&local_40,this);
  full_path_name_abi_cxx11_(&local_60,local_20);
  _Var1 = std::operator==(&local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  if (_Var1) {
    this_local._7_1_ = false;
  }
  else {
    prim_part_abi_cxx11_(this);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      prim_part_abi_cxx11_(local_20);
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        bVar2 = LessThan(this,local_20);
        return bVar2;
      }
    }
    prim_part_abi_cxx11_(this);
    uVar3 = std::__cxx11::string::empty();
    local_7a = false;
    if ((uVar3 & 1) != 0) {
      prim_part_abi_cxx11_(local_20);
      lVar5 = std::__cxx11::string::size();
      local_7a = lVar5 != 0;
    }
    this_local._7_1_ = local_7a;
  }
  return this_local._7_1_;
}

Assistant:

bool operator<(const Path &rhs) const {
    if (full_path_name() == rhs.full_path_name()) {
      return false;
    }

    if (prim_part().empty() || rhs.prim_part().empty()) {
      return prim_part().empty() && rhs.prim_part().size();
    }

    return LessThan(*this, rhs);
  }